

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

string * __thiscall
pbrt::ParameterDictionary::ToParameterDefinition
          (string *__return_storage_ptr__,ParameterDictionary *this,string *name)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParameterDictionary *this_00;
  __type _Var3;
  int in_ECX;
  long lVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  allocator<char> local_31;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar5 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar5 = paVar1;
  }
  lVar4 = 0;
  do {
    if (sVar2 << 3 == lVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_31);
      return __return_storage_ptr__;
    }
    this_00 = *(ParameterDictionary **)((long)paVar5 + lVar4);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(this_00->params).field_2 + 0x10),name);
    lVar4 = lVar4 + 8;
  } while (!_Var3);
  ToParameterDefinition_abi_cxx11_(__return_storage_ptr__,this_00,(ParsedParameter *)0x0,in_ECX);
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToParameterDefinition(const std::string &name) const {
    for (const ParsedParameter *p : params)
        if (p->name == name)
            return ToParameterDefinition(p, 0);
    return "";
}